

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int findfield(lua_State *L,int objidx,int level)

{
  int iVar1;
  int level_local;
  int objidx_local;
  lua_State *L_local;
  
  if ((level != 0) && (iVar1 = lua_type(L,-1), iVar1 == 5)) {
    lua_pushnil(L);
    while (iVar1 = lua_next(L,-2), iVar1 != 0) {
      iVar1 = lua_type(L,-2);
      if (iVar1 == 4) {
        iVar1 = lua_rawequal(L,objidx,-1);
        if (iVar1 != 0) {
          lua_settop(L,-2);
          return 1;
        }
        iVar1 = findfield(L,objidx,level + -1);
        if (iVar1 != 0) {
          lua_remove(L,-2);
          lua_pushlstring(L,".",1);
          lua_insert(L,-2);
          lua_concat(L,3);
          return 1;
        }
      }
      lua_settop(L,-2);
    }
  }
  return 0;
}

Assistant:

static int findfield (lua_State *L, int objidx, int level) {
  if (level == 0 || !lua_istable(L, -1))
    return 0;  /* not found */
  lua_pushnil(L);  /* start 'next' loop */
  while (lua_next(L, -2)) {  /* for each pair in table */
    if (lua_type(L, -2) == LUA_TSTRING) {  /* ignore non-string keys */
      if (lua_rawequal(L, objidx, -1)) {  /* found object? */
        lua_pop(L, 1);  /* remove value (but keep name) */
        return 1;
      }
      else if (findfield(L, objidx, level - 1)) {  /* try recursively */
        lua_remove(L, -2);  /* remove table (but keep name) */
        lua_pushliteral(L, ".");
        lua_insert(L, -2);  /* place '.' between the two names */
        lua_concat(L, 3);
        return 1;
      }
    }
    lua_pop(L, 1);  /* remove value */
  }
  return 0;  /* not found */
}